

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::ExtractValueInst::ExtractValueInst
          (ExtractValueInst *this,Type *type,Value *aggregate,Vector<unsigned_int> *indices_)

{
  initializer_list<LLVMBC::Value_*> __l;
  allocator_type local_59;
  Value *local_58;
  iterator local_50;
  undefined8 local_48;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_40;
  Vector<unsigned_int> *local_28;
  Vector<unsigned_int> *indices__local;
  Value *aggregate_local;
  Type *type_local;
  ExtractValueInst *this_local;
  
  local_28 = indices_;
  indices__local = (Vector<unsigned_int> *)aggregate;
  aggregate_local = (Value *)type;
  type_local = (Type *)this;
  Instruction::Instruction(&this->super_Instruction,type,ExtractValue);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&this->indices,indices_);
  local_58 = (Value *)indices__local;
  local_50 = &local_58;
  local_48 = 1;
  __l._M_len = 1;
  __l._M_array = local_50;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_40,__l,&local_59);
  Instruction::set_operands(&this->super_Instruction,&local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_40)
  ;
  return;
}

Assistant:

ExtractValueInst::ExtractValueInst(Type *type, Value *aggregate, Vector<unsigned> indices_)
    : Instruction(type, ValueKind::ExtractValue)
    , indices(std::move(indices_))
{
	set_operands({ aggregate });
}